

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O3

string * to_timestamp_abi_cxx11_(string *__return_storage_ptr__,int64_t t,bool comma)

{
  size_t sVar1;
  string *extraout_RAX;
  char buf [32];
  
  snprintf(buf,0x20,"%02d:%02d:%02d%s%03d");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(buf);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,buf,buf + sVar1);
  return extraout_RAX;
}

Assistant:

static std::string to_timestamp(int64_t t, bool comma = false) {
    int64_t msec = t * 10;
    int64_t hr = msec / (1000 * 60 * 60);
    msec = msec - hr * (1000 * 60 * 60);
    int64_t min = msec / (1000 * 60);
    msec = msec - min * (1000 * 60);
    int64_t sec = msec / 1000;
    msec = msec - sec * 1000;

    char buf[32];
    snprintf(buf, sizeof(buf), "%02d:%02d:%02d%s%03d", (int) hr, (int) min, (int) sec, comma ? "," : ".", (int) msec);

    return std::string(buf);
}